

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O1

void __thiscall
BayesianGameIdenticalPayoff::~BayesianGameIdenticalPayoff(BayesianGameIdenticalPayoff *this)

{
  (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
  super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
  _vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)&PTR__BayesianGameIdenticalPayoff_005a1350
  ;
  if (this->_m_utilFunction == (RewardModelDiscreteInterface *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "BayesianGameIdenticalPayoff::~BayesianGameIdenticalPayoff() trying to delete this BG twice!"
               ,0x5b);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
  }
  else {
    (*(this->_m_utilFunction->super_QTableInterface)._vptr_QTableInterface[3])();
    this->_m_utilFunction = (RewardModelDiscreteInterface *)0x0;
  }
  BayesianGameBase::~BayesianGameBase((BayesianGameBase *)this);
  return;
}

Assistant:

BayesianGameIdenticalPayoff::~BayesianGameIdenticalPayoff()
{
    if (_m_utilFunction != 0)
    {
        delete _m_utilFunction;
        _m_utilFunction = 0;
    }
    else
        cerr << "BayesianGameIdenticalPayoff::~BayesianGameIdenticalPayoff() trying to delete this BG twice!" << endl;
}